

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_18::Inlining::iteration
          (Inlining *this,
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          *inlinedInto)

{
  Index IVar1;
  uint uVar2;
  Module *pMVar3;
  __node_base_ptr relevantFuncs;
  bool bVar4;
  __int_type_conflict1 _Var5;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  reference this_01;
  pointer pFVar6;
  PassRunner *pPVar7;
  reference pNVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  Function *pFVar12;
  mapped_type *pmVar13;
  mapped_type *this_02;
  pair<std::__detail::_Node_iterator<wasm::Function_*,_true,_false>,_bool> pVar14;
  anon_class_16_2_f884057e visitor;
  anon_class_16_2_ccdd3984 local_480;
  function<bool_(wasm::Function_*)> local_470;
  undefined1 local_450 [8];
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_448;
  undefined1 local_440 [8];
  FilteredPassRunner runner;
  undefined1 auStack_318 [8];
  Name inlinedName;
  Function *local_300;
  Function *inlinedFunction;
  InliningAction *action;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  Function *local_2c0;
  Function *func_1;
  Name name;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2_1;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  inlinedUses;
  ChosenActions chosenActions;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 local_88 [8];
  InliningState state;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  *inlinedInto_local;
  Inlining *this_local;
  
  state.actionsForFunction._M_h._M_single_bucket = (__node_base_ptr)inlinedInto;
  InliningState::InliningState((InliningState *)local_88);
  visitor.state = (InliningState *)this;
  visitor.this = (Inlining *)local_88;
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::(anonymous_namespace)::Inlining::iteration(std::unordered_set<wasm::Function*,std::hash<wasm::Function*>,std::equal_to<wasm::Function*>,std::allocator<wasm::Function*>>&)::_lambda(wasm::Function*)_1_>
            ((ModuleUtils *)this->module,(Module *)this,visitor);
  bVar4 = std::
          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::InliningMode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>_>
          ::empty((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::InliningMode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>_>
                   *)local_88);
  if (bVar4) {
    funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
    this_00 = &this->module->functions;
    __end2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(this_00);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func), bVar4) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end2);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (this_01);
      std::
      unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
      ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                    *)&state.inlinableFunctions._M_h._M_single_bucket,(key_type *)pFVar6);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (this_01);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2,(value_type *)pFVar6);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end2);
    }
    Planner::Planner((Planner *)&chosenActions._M_h._M_single_bucket,(InliningState *)local_88);
    pPVar7 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
    ::run((WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
           *)&chosenActions._M_h._M_single_bucket,pPVar7,this->module);
    Planner::~Planner((Planner *)&chosenActions._M_h._M_single_bucket);
    std::
    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
    ::unordered_map((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                     *)&inlinedUses._M_h._M_single_bucket);
    std::
    unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
    ::unordered_map((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                     *)&__range2_1);
    __end2_1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
    name.super_IString.str._M_str =
         (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                               *)&name.super_IString.str._M_str), bVar4) {
      pNVar8 = __gnu_cxx::
               __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
               ::operator*(&__end2_1);
      func_1 = (Function *)(pNVar8->super_IString).str._M_len;
      name.super_IString.str._M_len = (size_t)(pNVar8->super_IString).str._M_str;
      local_2c0 = Module::getFunction(this->module,(Name)(pNVar8->super_IString).str);
      sVar9 = std::
              unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
              ::count((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                       *)&__range2_1,(key_type *)local_2c0);
      if (sVar9 == 0) {
        pmVar10 = std::
                  unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                  ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                *)&state.inlinableFunctions._M_h._M_single_bucket,
                               (key_type *)&func_1);
        __end3 = std::
                 vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                 ::begin(pmVar10);
        action = (InliningAction *)
                 std::
                 vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                 ::end(pmVar10);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::(anonymous_namespace)::InliningAction_*,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>
                                           *)&action), bVar4) {
          inlinedFunction =
               (Function *)
               __gnu_cxx::
               __normal_iterator<wasm::(anonymous_namespace)::InliningAction_*,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>
               ::operator*(&__end3);
          local_300 = (Function *)
                      (inlinedFunction->super_Importable).super_Named.name.super_IString.str._M_str;
          sVar11 = std::
                   unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   ::count((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                            *)state.actionsForFunction._M_h._M_single_bucket,&local_300);
          if (sVar11 == 0) {
            auStack_318 = (undefined1  [8])
                          (local_300->super_Importable).super_Named.name.super_IString.str._M_len;
            inlinedName.super_IString.str._M_len =
                 (size_t)(local_300->super_Importable).super_Named.name.super_IString.str._M_str;
            bVar4 = isUnderSizeLimit(this,(Name)(local_2c0->super_Importable).super_Named.name.
                                                super_IString.str,
                                     (Name)(local_300->super_Importable).super_Named.name.
                                           super_IString.str);
            if (bVar4) {
              pFVar12 = getActuallyInlinedFunction
                                  (this,(Function *)
                                        (inlinedFunction->super_Importable).super_Named.name.
                                        super_IString.str._M_str);
              (inlinedFunction->super_Importable).super_Named.name.super_IString.str._M_str =
                   (char *)pFVar12;
              IVar1 = this->inlinedNameHint;
              this->inlinedNameHint = IVar1 + 1;
              *(Index *)&(inlinedFunction->super_Importable).super_Named.field_0x14 = IVar1;
              pmVar10 = std::
                        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                      *)&inlinedUses._M_h._M_single_bucket,(key_type *)local_2c0);
              std::
              vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
              ::push_back(pmVar10,(value_type *)inlinedFunction);
              pmVar13 = std::
                        unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                        ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                                      *)&__range2_1,(key_type *)auStack_318);
              *pmVar13 = *pmVar13 + 1;
              pVar14 = std::
                       unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                       ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                                 *)state.actionsForFunction._M_h._M_single_bucket,&local_2c0);
              runner.relevantFuncs =
                   (FuncSet *)pVar14.first.super__Node_iterator_base<wasm::Function_*,_false>._M_cur
              ;
              pmVar13 = std::
                        unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                        ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                                      *)&__range2_1,(key_type *)auStack_318);
              uVar2 = *pmVar13;
              this_02 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](&this->infos,(key_type *)auStack_318);
              _Var5 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)this_02);
              if (_Var5 < uVar2) {
                __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                              ,0x555,
                              "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                             );
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<wasm::(anonymous_namespace)::InliningAction_*,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>
          ::operator++(&__end3);
        }
      }
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end2_1);
    }
    bVar4 = std::
            unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
            ::empty((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                     *)&inlinedUses._M_h._M_single_bucket);
    relevantFuncs = state.actionsForFunction._M_h._M_single_bucket;
    if (bVar4) {
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      pMVar3 = this->module;
      pPVar7 = Pass::getPassRunner(&this->super_Pass);
      PassUtils::FilteredPassRunner::FilteredPassRunner
                ((FilteredPassRunner *)local_440,pMVar3,(FuncSet *)relevantFuncs,&pPVar7->options);
      PassRunner::setIsNested((PassRunner *)local_440,true);
      std::
      make_unique<wasm::(anonymous_namespace)::DoInlining,std::unordered_map<wasm::Name,std::vector<wasm::(anonymous_namespace)::InliningAction,std::allocator<wasm::(anonymous_namespace)::InliningAction>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::(anonymous_namespace)::InliningAction,std::allocator<wasm::(anonymous_namespace)::InliningAction>>>>>&>
                ((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                  *)local_450);
      std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
      unique_ptr<wasm::(anonymous_namespace)::DoInlining,std::default_delete<wasm::(anonymous_namespace)::DoInlining>,void>
                ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_448,
                 (unique_ptr<wasm::(anonymous_namespace)::DoInlining,_std::default_delete<wasm::(anonymous_namespace)::DoInlining>_>
                  *)local_450);
      PassRunner::add((PassRunner *)local_440,&local_448);
      std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_448);
      std::
      unique_ptr<wasm::(anonymous_namespace)::DoInlining,_std::default_delete<wasm::(anonymous_namespace)::DoInlining>_>
      ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::DoInlining,_std::default_delete<wasm::(anonymous_namespace)::DoInlining>_>
                     *)local_450);
      if ((this->optimize & 1U) != 0) {
        OptUtils::addUsefulPassesAfterInlining((PassRunner *)local_440);
      }
      PassRunner::run((PassRunner *)local_440);
      PassUtils::FilteredPassRunner::~FilteredPassRunner((FilteredPassRunner *)local_440);
      pMVar3 = this->module;
      local_480.inlinedUses =
           (unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
            *)&__range2_1;
      local_480.this = this;
      std::function<bool(wasm::Function*)>::
      function<wasm::(anonymous_namespace)::Inlining::iteration(std::unordered_set<wasm::Function*,std::hash<wasm::Function*>,std::equal_to<wasm::Function*>,std::allocator<wasm::Function*>>&)::_lambda(wasm::Function*)_2_,void>
                ((function<bool(wasm::Function*)> *)&local_470,&local_480);
      Module::removeFunctions(pMVar3,&local_470);
      std::function<bool_(wasm::Function_*)>::~function(&local_470);
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    std::
    unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                      *)&__range2_1);
    std::
    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      *)&inlinedUses._M_h._M_single_bucket);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
  }
  InliningState::~InliningState((InliningState *)local_88);
  return;
}

Assistant:

void iteration(std::unordered_set<Function*>& inlinedInto) {
    // decide which to inline
    InliningState state;
    ModuleUtils::iterDefinedFunctions(*module, [&](Function* func) {
      InliningMode inliningMode = getInliningMode(func->name);
      assert(inliningMode != InliningMode::Unknown);
      if (inliningMode != InliningMode::Uninlineable) {
        state.inlinableFunctions[func->name] = inliningMode;
      }
    });
    if (state.inlinableFunctions.empty()) {
      return;
    }
    // Fill in actionsForFunction, as we operate on it in parallel (each
    // function to its own entry). Also generate a vector of the function names
    // so that in the later loop we can iterate on it deterministically and
    // without iterator invalidation.
    std::vector<Name> funcNames;
    for (auto& func : module->functions) {
      state.actionsForFunction[func->name];
      funcNames.push_back(func->name);
    }

    // Find and plan inlinings in parallel. This discovers inlining
    // opportunities, by themselves, but does not yet take into account
    // interactions between them (e.g. we don't want to both inline into a
    // function and then inline it as well).
    Planner(&state).run(getPassRunner(), module);

    // Choose which inlinings to perform. We do this sequentially so that we
    // can consider interactions between them, and avoid nondeterminism.
    ChosenActions chosenActions;

    // How many uses (calls of the function) we inlined.
    std::unordered_map<Name, Index> inlinedUses;

    for (auto name : funcNames) {
      auto* func = module->getFunction(name);
      // if we've inlined a function, don't inline into it in this iteration,
      // avoid risk of races
      // note that we do not risk stalling progress, as each iteration() will
      // inline at least one call before hitting this
      if (inlinedUses.count(func->name)) {
        continue;
      }
      for (auto& action : state.actionsForFunction[name]) {
        auto* inlinedFunction = action.contents;
        // if we've inlined into a function, don't inline it in this iteration,
        // avoid risk of races
        // note that we do not risk stalling progress, as each iteration() will
        // inline at least one call before hitting this
        if (inlinedInto.count(inlinedFunction)) {
          continue;
        }
        Name inlinedName = inlinedFunction->name;
        if (!isUnderSizeLimit(func->name, inlinedName)) {
          continue;
        }

        // Success - we can inline.
#ifdef INLINING_DEBUG
        std::cout << "inline " << inlinedName << " into " << func->name << '\n';
#endif

        // Update the action for the actual inlining we have chosen to perform
        // (when splitting, we will actually inline one of the split pieces and
        // not the original function itself; note how even if we do that then
        // we are still removing a call to the original function here, and so
        // we do not need to change anything else lower down - we still want to
        // note that we got rid of one use of the original function).
        action.contents = getActuallyInlinedFunction(action.contents);
        action.nameHint = inlinedNameHint++;
        chosenActions[func->name].push_back(action);
        inlinedUses[inlinedName]++;
        inlinedInto.insert(func);
        assert(inlinedUses[inlinedName] <= infos[inlinedName].refs);
      }
    }

    if (chosenActions.empty()) {
      // We found nothing to do.
      return;
    }

    // Perform the inlinings in parallel (sequentially inside each function we
    // inline into, but in parallel between them). If we are optimizing, do so
    // as well.
    {
      PassUtils::FilteredPassRunner runner(
        module, inlinedInto, getPassRunner()->options);
      runner.setIsNested(true);
      runner.add(std::make_unique<DoInlining>(chosenActions));
      if (optimize) {
        OptUtils::addUsefulPassesAfterInlining(runner);
      }
      runner.run();
    }

    // remove functions that we no longer need after inlining
    module->removeFunctions([&](Function* func) {
      auto name = func->name;
      auto& info = infos[name];
      return inlinedUses.count(name) && inlinedUses[name] == info.refs &&
             !info.usedGlobally;
    });
  }